

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_io.c
# Opt level: O2

int unix_timeout_read_func(void *conn,void *buffer,size_t length,int *errno_p,char **result_p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  int *piVar7;
  uint uVar8;
  uint local_4c;
  int local_3c;
  
  iVar3 = (int)conn;
  local_4c = fcntl(iVar3,3,0);
  iVar2 = fcntl(iVar3,4);
  if (iVar2 == -1) {
    perror("fcntl block");
  }
  sVar6 = read(iVar3,buffer,length);
  iVar2 = (int)sVar6;
  if (iVar2 == -1) {
    piVar7 = __errno_location();
    iVar5 = *piVar7;
    if (errno_p != (int *)0x0) {
      *errno_p = iVar5;
    }
    if ((iVar5 == 4) || (iVar5 == 0xb)) {
      if (errno_p != (int *)0x0) {
        *errno_p = 0;
      }
      iVar2 = 0;
    }
    else {
      local_4c = local_4c & 0xfffff7ff;
      iVar4 = fcntl(iVar3,4,(ulong)local_4c);
      iVar2 = -1;
      if (iVar4 == -1) {
        perror("fcntl nonblock");
      }
    }
    if ((iVar5 != 0xb) && (iVar5 != 4)) {
      return -1;
    }
  }
  else if (iVar2 == 0) {
    if (result_p != (char **)0x0) {
      *result_p = "End of file";
    }
    if (errno_p != (int *)0x0) {
      *errno_p = 0;
    }
    iVar2 = 0;
    iVar3 = fcntl(iVar3,4,(ulong)(local_4c & 0xfffff7ff));
    goto LAB_00121b87;
  }
  iVar5 = (int)length;
  uVar8 = iVar5 - iVar2;
  bVar1 = false;
  local_3c = -1;
  while( true ) {
    if ((int)uVar8 < 1) {
      iVar2 = fcntl(iVar3,4,(ulong)(local_4c & 0xfffff7ff));
      if (iVar2 == -1) {
        perror("fcntl nonblock");
      }
      return iVar5;
    }
    if (bVar1) break;
    sleep(1);
    sVar6 = read(iVar3,(void *)((long)buffer + (length - uVar8)),(ulong)uVar8);
    iVar2 = (int)sVar6;
    if (iVar2 == -1) {
      piVar7 = __errno_location();
      iVar4 = *piVar7;
      if (errno_p != (int *)0x0) {
        *errno_p = iVar4;
      }
      if ((iVar4 == 4) || (iVar4 == 0xb)) {
        iVar2 = 0;
        if (errno_p != (int *)0x0) {
          *errno_p = 0;
        }
      }
      else {
        local_4c = local_4c & 0xfffff7ff;
        iVar2 = fcntl(iVar3,4);
        if (iVar2 == -1) {
          perror("fcntl nonblock");
        }
        local_3c = iVar5 - uVar8;
        iVar2 = -1;
      }
      if ((iVar4 != 0xb) && (iVar4 != 4)) {
        return local_3c;
      }
    }
    else if (iVar2 == 0) {
      if (result_p != (char **)0x0) {
        *result_p = "End of file";
      }
      if (errno_p != (int *)0x0) {
        *errno_p = 0;
      }
      iVar2 = fcntl(iVar3,4,(ulong)(local_4c & 0xfffff7ff));
      if (iVar2 == -1) {
        perror("fcntl nonblock");
      }
      return iVar5 - uVar8;
    }
    uVar8 = uVar8 - iVar2;
    bVar1 = true;
  }
  iVar3 = fcntl(iVar3,4,(ulong)(local_4c & 0xfffff7ff));
  iVar2 = -1;
LAB_00121b87:
  if (iVar3 != -1) {
    return iVar2;
  }
  perror("fcntl nonblock");
  return iVar2;
}

Assistant:

int
unix_timeout_read_func(void *conn, void *buffer, size_t length, int *errno_p, char **result_p)
{
    int left = length;
    int count = 2;
    int iget;
    int fd = (int) (long) conn;
    int fdflags = fcntl(fd, F_GETFL, 0);

    fdflags |= O_NONBLOCK;
    if (fcntl(fd, F_SETFL, fdflags) == -1) 
	perror("fcntl block");
    iget = read(fd, (char *) buffer, length);
    if (iget == 0) {
	if (result_p) *result_p = "End of file";
	if (errno_p) *errno_p = 0;
	fdflags &= ~O_NONBLOCK;
	if (fcntl(fd, F_SETFL, fdflags) == -1) 
	    perror("fcntl nonblock");
	return 0;		/* end of file */
    } else if (iget == -1) {
	int lerrno = errno;
	if (errno_p) *errno_p = lerrno;
	if ((lerrno != EWOULDBLOCK) &&
	    (lerrno != EAGAIN) &&
	    (lerrno != EINTR)) {
	    /* serious error */
	    fdflags &= ~O_NONBLOCK;
	    if (fcntl(fd, F_SETFL, fdflags) == -1) 
		perror("fcntl nonblock");
	    return -1;
	} else {
	    if (errno_p) *errno_p = 0;
	    iget = 0;
	}
    }
    left = length - iget;
    while (left > 0) {
	count--;
	if (count <= 0) {
	    fdflags &= ~O_NONBLOCK;
	    if (fcntl(fd, F_SETFL, fdflags) == -1) 
		perror("fcntl nonblock");
	    return -1;
	}
	sleep(1);
	iget = read(fd, (char *) buffer + length - left, left);
	if (iget == 0) {
	    if (result_p) *result_p = "End of file";
	    if (errno_p) *errno_p = 0;
	    fdflags &= ~O_NONBLOCK;
	    if (fcntl(fd, F_SETFL, fdflags) == -1) 
		perror("fcntl nonblock");
	    return length - left;	/* end of file */
	} else if (iget == -1) {
	    int lerrno = errno;
	    if (errno_p) *errno_p = errno;
	    if ((lerrno != EWOULDBLOCK) &&
		(lerrno != EAGAIN) &&
		(lerrno != EINTR)) {
		/* serious error */
		fdflags &= ~O_NONBLOCK;
		if (fcntl(fd, F_SETFL, fdflags) == -1) 
		    perror("fcntl nonblock");
		return (length - left);
	    } else {
		if (errno_p) *errno_p = 0;
		iget = 0;
	    }
	}
	left -= iget;
    }
    fdflags &= ~O_NONBLOCK;
    if (fcntl(fd, F_SETFL, fdflags) == -1) 
	perror("fcntl nonblock");
    return length;
}